

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

int __thiscall
Indexing::ClauseCodeTree::LiteralMatcher::init(LiteralMatcher *this,EVP_PKEY_CTX *ctx)

{
  CodeOp *elem;
  ulong uVar1;
  CodeOp **ppCVar2;
  CodeOp **extraout_RAX;
  undefined7 extraout_var;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  CodeOp **ppCVar3;
  size_t in_R8;
  int in_R9D;
  bool bVar4;
  
  CodeTree::Matcher::init(&this->super_Matcher,ctx);
  (this->super_Matcher).linfos = (LitInfo *)CONCAT71(in_register_00000009,in_CL);
  (this->super_Matcher).linfoCnt = in_R8;
  this->_eagerlyMatched = false;
  ppCVar2 = (this->eagerResults)._stack;
  (this->eagerResults)._cursor = ppCVar2;
  if (in_R9D != 0) {
    this->_eagerlyMatched = true;
    (this->super_Matcher)._fresh = false;
    ppCVar3 = &(this->super_Matcher).entry;
    while (elem = *ppCVar3, elem != (CodeOp *)0x0) {
      uVar1 = elem->_content;
      bVar4 = (uVar1 & 7) != 0;
      ppCVar2 = (CodeOp **)CONCAT71((int7)(uVar1 >> 8),uVar1 == 0 || bVar4);
      if (uVar1 != 0 && !bVar4) {
        Lib::Stack<Indexing::CodeTree::CodeOp_*>::push(&this->eagerResults,elem);
        ppCVar2 = extraout_RAX;
      }
      ppCVar3 = &elem->_alternative;
    }
    return (int)ppCVar2;
  }
  bVar4 = CodeTree::Matcher::prepareLiteral(&this->super_Matcher);
  return (int)CONCAT71(extraout_var,bVar4);
}

Assistant:

void ClauseCodeTree::LiteralMatcher::init(CodeTree* tree_, CodeOp* entry_,
					  LitInfo* linfos_, size_t linfoCnt_,
					  bool seekOnlySuccess)
{
  ASS_G(linfoCnt_,0);

  Matcher::init(tree_,entry_);

  linfos=linfos_;
  linfoCnt=linfoCnt_;

  _eagerlyMatched=false;
  eagerResults.reset();

  RSTAT_CTR_INC("LiteralMatcher::init");
  if(seekOnlySuccess) {
    RSTAT_CTR_INC("LiteralMatcher::init - seekOnlySuccess");
    //we are interested only in SUCCESS operations
    //(and those must be at the entry point or its alternatives)

    _eagerlyMatched=true;
    _fresh=false;
    CodeOp* sop=entry;
    while(sop) {
      if(sop->isSuccess()) {
	eagerResults.push(sop);
      }
      sop=sop->alternative();
    }
    return;
  }

  ALWAYS(prepareLiteral());
}